

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

int match_udp(void *data,packet_t *pkt)

{
  uint16_t uVar1;
  int iVar2;
  match_udp_t *m;
  packet_t *pkt_local;
  void *data_local;
  
  if ((pkt->ip_proto == '\x11') && (pkt->udp != (udp_t *)0x0)) {
    uVar1 = ntohs(pkt->udp->src);
    iVar2 = match_port(uVar1,(uint16_t *)data);
    if ((iVar2 == 0) == ((*(byte *)((long)data + 8) & 1) != 0)) {
      uVar1 = ntohs(pkt->udp->dst);
      iVar2 = match_port(uVar1,(uint16_t *)((long)data + 4));
      if ((iVar2 == 0) == ((*(byte *)((long)data + 8) & 2) != 0)) {
        data_local._4_4_ = 1;
      }
      else {
        data_local._4_4_ = 0;
      }
    }
    else {
      data_local._4_4_ = 0;
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int match_udp(void *data, packet_t *pkt)
{
	match_udp_t *m = (match_udp_t *)data;

	if (pkt->ip_proto != IPPROTO_UDP || pkt->udp == NULL) {
		return 0;
	}

	if (INVF(m, INV_UDP_SRC, !match_port(ntohs(pkt->udp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_UDP_DST, !match_port(ntohs(pkt->udp->dst), m->dst))) {
		return 0;
	}

	return 1;
}